

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

void chaiscript::dispatch::detail::
     call_func<chaiscript::dispatch::detail::Caller<void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&>,void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,chaiscript::Boxed_Value_const&,0ul,1ul>
               (undefined8 param_1,void *param_2,long *param_3,Type_Conversions_State *param_4)

{
  Result_Type o;
  chaiscript local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  o = boxed_cast<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&>
                ((Boxed_Value *)*param_3,param_4);
  boxed_cast<chaiscript::Boxed_Value_const&>(local_30,(Boxed_Value *)(*param_3 + 0x10),param_4);
  Caller<void,std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>,chaiscript::Boxed_Value_const&>
  ::operator()(param_2,o,(Boxed_Value *)local_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  return;
}

Assistant:

Ret call_func(const chaiscript::dispatch::detail::Function_Signature<Ret (Params...)> &, Indexes<I...>, const Callable &f,
            const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
        {
          (void)params; (void)t_conversions;
          return f(boxed_cast<Params>(params[I], &t_conversions)...);
        }